

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty_printer.hpp
# Opt level: O3

void __thiscall
trial::protocol::json::example::pretty_printer::indent(pretty_printer *this,int level)

{
  basic_writer<char,_16UL> *this_00;
  long *local_48;
  size_t local_40;
  long local_38 [2];
  view_type local_28;
  
  this_00 = this->writer;
  local_48 = local_38;
  std::__cxx11::string::_M_construct((ulong)&local_48,(char)level * (char)this->indent_width);
  local_28._M_len = local_40;
  local_28._M_str = (char *)local_48;
  basic_writer<char,_16UL>::literal(this_00,&local_28);
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return;
}

Assistant:

void indent(int level)
    {
        writer.literal(std::string(indent_width * level, ' '));
    }